

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

bool __thiscall
QConcatenateTablesProxyModel::canDropMimeData
          (QConcatenateTablesProxyModel *this,QMimeData *data,DropAction action,int row,int column,
          QModelIndex *parent)

{
  bool bVar1;
  byte bVar2;
  QConcatenateTablesProxyModelPrivate *sourceColumn_00;
  int in_ECX;
  int in_EDX;
  QConcatenateTablesProxyModelPrivate *in_RSI;
  undefined4 in_R8D;
  int *in_R9;
  long in_FS_OFFSET;
  QConcatenateTablesProxyModelPrivate *d;
  undefined4 in_stack_00000030;
  QAbstractItemModel *sourceModel;
  QModelIndex sourceParent;
  int sourceColumn;
  int sourceRow;
  undefined1 **ppuVar3;
  long **pplVar4;
  undefined4 in_stack_ffffffffffffffa8;
  bool local_31;
  long *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sourceColumn_00 = d_func((QConcatenateTablesProxyModel *)0x858282);
  bVar1 = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::isEmpty
                    ((QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *)0x858298);
  if (bVar1) {
    local_31 = false;
  }
  else {
    local_c = 0xaaaaaaaa;
    local_10 = 0xaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QModelIndex::QModelIndex((QModelIndex *)0x8582e6);
    local_30 = (long *)&DAT_aaaaaaaaaaaaaaaa;
    ppuVar3 = &local_28;
    pplVar4 = &local_30;
    bVar1 = QConcatenateTablesProxyModelPrivate::mapDropCoordinatesToSource
                      (in_RSI,in_EDX,in_ECX,
                       (QModelIndex *)CONCAT44(in_R8D,in_stack_ffffffffffffffa8),in_R9,
                       (int *)sourceColumn_00,(QModelIndex *)CONCAT44(column,in_stack_00000030),
                       (QAbstractItemModel **)CONCAT44(action,row));
    if (bVar1) {
      bVar2 = (**(code **)(*local_30 + 0xd8))
                        (local_30,in_RSI,in_EDX,local_c,local_10,&local_28,ppuVar3,pplVar4);
      local_31 = (bool)(bVar2 & 1);
    }
    else {
      local_31 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_31;
  }
  __stack_chk_fail();
}

Assistant:

bool QConcatenateTablesProxyModel::canDropMimeData(const QMimeData *data, Qt::DropAction action, int row, int column, const QModelIndex &parent) const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_models.isEmpty())
        return false;

    int sourceRow, sourceColumn;
    QModelIndex sourceParent;
    QAbstractItemModel *sourceModel;
    if (!d->mapDropCoordinatesToSource(row, column, parent, &sourceRow, &sourceColumn, &sourceParent, &sourceModel))
        return false;
    return sourceModel->canDropMimeData(data, action, sourceRow, sourceColumn, sourceParent);
}